

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonelist.h
# Opt level: O0

void __thiscall
asmjit::v1_14::ZoneList<asmjit::v1_14::JitAllocatorBlock>::_addNode
          (ZoneList<asmjit::v1_14::JitAllocatorBlock> *this,JitAllocatorBlock *node,size_t dir)

{
  long lVar1;
  JitAllocatorBlock *prev;
  size_t dir_local;
  JitAllocatorBlock *node_local;
  ZoneList<asmjit::v1_14::JitAllocatorBlock> *this_local;
  
  lVar1 = *(long *)(this + dir * 8);
  *(long *)(&node->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock> +
           (ulong)((dir != 0 ^ 0xffU) & 1) * 8) = lVar1;
  *(JitAllocatorBlock **)(this + dir * 8) = node;
  if (lVar1 == 0) {
    *(JitAllocatorBlock **)(this + (ulong)((dir != 0 ^ 0xffU) & 1) * 8) = node;
  }
  else {
    *(JitAllocatorBlock **)(lVar1 + 0x10 + dir * 8) = node;
  }
  return;
}

Assistant:

inline void _addNode(NodeT* node, size_t dir) noexcept {
    NodeT* prev = _nodes[dir];

    node->_listNodes[!dir] = prev;
    _nodes[dir] = node;
    if (prev)
      prev->_listNodes[dir] = node;
    else
      _nodes[!dir] = node;
  }